

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O2

void crnlib::MovePos(CLzmaEnc *p,UInt32 num)

{
  if (num != 0) {
    p->additionalOffset = p->additionalOffset + num;
    (*(p->matchFinder).Skip)(p->matchFinderObj,num);
    return;
  }
  return;
}

Assistant:

static void MovePos(CLzmaEnc* p, UInt32 num) {
#ifdef SHOW_STAT
  ttt += num;
  printf("\n MovePos %d", num);
#endif
  if (num != 0) {
    p->additionalOffset += num;
    p->matchFinder.Skip(p->matchFinderObj, num);
  }
}